

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O3

void writecode(uchar *block,aint length,unsigned_short loadaddr,bool header,FILE *fp)

{
  byte bVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  
  if ((int)CONCAT71(in_register_00000009,header) != 0) {
    writeheader('\x03',"loader",(unsigned_short)length,loadaddr,0,fp);
  }
  writeword(length + 2,fp);
  parity = '\0';
  fputc(0xff,(FILE *)fp);
  bVar1 = ~parity;
  if (0 < length) {
    uVar2 = 0;
    parity = bVar1;
    do {
      bVar1 = block[uVar2];
      fputc((uint)bVar1,(FILE *)fp);
      bVar1 = parity ^ bVar1;
      uVar2 = uVar2 + 1;
      parity = bVar1;
    } while ((uint)length != uVar2);
  }
  parity = bVar1;
  fputc((uint)bVar1,(FILE *)fp);
  parity = parity ^ bVar1;
  return;
}

Assistant:

static void writecode(unsigned char* block, aint length, unsigned short loadaddr, bool header, FILE *fp) {
	if (header) {
		/* Filetype (3: Code) */
		writeheader(3, "loader", length, loadaddr, 0, fp);
	}

	/* Now onto the data bit */
	writeword(length + 2, fp);	/* Length of next block */
	parity = 0;
	writebyte(255, fp); /* Data... */
	for (aint i = 0; i < length; i++) {
		writebyte(block[i], fp);
	}
	writebyte(parity, fp);
}